

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

uint __thiscall MidiInApi::MidiQueue::size(MidiQueue *this,uint *__back,uint *__front)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_2c;
  uint _size;
  uint _front;
  uint _back;
  uint *__front_local;
  uint *__back_local;
  MidiQueue *this_local;
  
  uVar1 = this->back;
  uVar2 = this->front;
  if (uVar1 < uVar2) {
    iVar3 = this->ringSize - uVar2;
  }
  else {
    iVar3 = -uVar2;
  }
  local_2c = uVar1 + iVar3;
  if (__back != (uint *)0x0) {
    *__back = uVar1;
  }
  if (__front != (uint *)0x0) {
    *__front = uVar2;
  }
  return local_2c;
}

Assistant:

unsigned int MidiInApi::MidiQueue::size( unsigned int *__back,
                                         unsigned int *__front )
{
  // Access back/front members exactly once and make stack copies for
  // size calculation
  unsigned int _back = back, _front = front, _size;
  if ( _back >= _front )
    _size = _back - _front;
  else
    _size = ringSize - _front + _back;

  // Return copies of back/front so no new and unsynchronized accesses
  // to member variables are needed.
  if ( __back ) *__back = _back;
  if ( __front ) *__front = _front;
  return _size;
}